

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyBalance.c
# Opt level: O2

Ivy_Obj_t *
Ivy_NodeBalanceBuildSuper(Ivy_Man_t *p,Vec_Ptr_t *vSuper,Ivy_Type_t Type,int fUpdateLevel)

{
  uint uVar1;
  void **ppvVar2;
  int i;
  void *pvVar3;
  void *pvVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *pIVar6;
  Ivy_Obj_t *Entry;
  Ivy_Obj_t *pIVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  Ivy_Obj_t *pIVar14;
  
  if ((long)vSuper->nSize < 2) {
    __assert_fail("vSuper->nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyBalance.c"
                  ,0xb3,
                  "Ivy_Obj_t *Ivy_NodeBalanceBuildSuper(Ivy_Man_t *, Vec_Ptr_t *, Ivy_Type_t, int)")
    ;
  }
  qsort(vSuper->pArray,(long)vSuper->nSize,8,Ivy_NodeCompareLevelsDecrease);
  uVar13 = (ulong)(uint)vSuper->nSize;
LAB_00737a68:
  do {
    iVar11 = (int)uVar13;
    if (iVar11 < 2) {
      pIVar5 = (Ivy_Obj_t *)Vec_PtrEntry(vSuper,0);
      return pIVar5;
    }
    iVar12 = 0;
    if (iVar11 != 2 && fUpdateLevel != 0) {
      pvVar3 = Vec_PtrEntry(vSuper,iVar11 + -2);
      for (iVar12 = iVar11 + -3; -1 < iVar12; iVar12 = iVar12 + -1) {
        pvVar4 = Vec_PtrEntry(vSuper,iVar12);
        if (0x7ff < (*(uint *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8) ^
                    *(uint *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 8))) goto LAB_00737ace;
      }
      iVar12 = -1;
LAB_00737ace:
      iVar12 = iVar12 + 1;
      pvVar4 = Vec_PtrEntry(vSuper,iVar12);
      if (0x7ff < (*(uint *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8) ^
                  *(uint *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 8))) {
        __assert_fail("Ivy_Regular(pObjLeft)->Level == Ivy_Regular(pObjRight)->Level",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyBalance.c"
                      ,0x13b,"int Ivy_NodeBalanceFindLeft(Vec_Ptr_t *)");
      }
      iVar11 = vSuper->nSize;
    }
    i = iVar11 + -2;
    if (i < iVar12) {
      __assert_fail("LeftBound <= RightBound",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyBalance.c"
                    ,0x151,"void Ivy_NodeBalancePermute(Ivy_Man_t *, Vec_Ptr_t *, int, int)");
    }
    if (i != iVar12) {
      pIVar5 = (Ivy_Obj_t *)Vec_PtrEntry(vSuper,iVar11 + -1);
      pIVar6 = (Ivy_Obj_t *)Vec_PtrEntry(vSuper,i);
      pIVar14 = (Ivy_Obj_t *)((ulong)pIVar5 & 0xfffffffffffffffe);
      if ((p->pConst1 != pIVar14) &&
         (iVar11 = i, p->pConst1 != (Ivy_Obj_t *)((ulong)pIVar6 & 0xfffffffffffffffe))) {
        for (; iVar12 <= iVar11; iVar11 = iVar11 + -1) {
          Entry = (Ivy_Obj_t *)Vec_PtrEntry(vSuper,iVar11);
          pIVar7 = (Ivy_Obj_t *)((ulong)Entry & 0xfffffffffffffffe);
          if (p->pConst1 == pIVar7) {
LAB_00737c0f:
            Vec_PtrWriteEntry(vSuper,iVar11,pIVar6);
            Vec_PtrWriteEntry(vSuper,i,Entry);
            break;
          }
          if ((Type != IVY_EXOR) && (pIVar14->Id == 0)) {
            __assert_fail("Type != IVY_AND || !Ivy_ObjIsConst1(Ivy_Regular(p0))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                          ,0x137,
                          "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                         );
          }
          if (Entry == (Ivy_Obj_t *)0x0) {
            pIVar7 = (Ivy_Obj_t *)0x0;
          }
          else if (pIVar7->Id == 0) {
            __assert_fail("p1 == NULL || !Ivy_ObjIsConst1(Ivy_Regular(p1))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                          ,0x138,
                          "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                         );
          }
          if (pIVar14 == pIVar7) {
            __assert_fail("Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                          ,0x139,
                          "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                         );
          }
          *(uint *)&(p->Ghost).field_0x8 =
               (*(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0) + (Type == IVY_EXOR) + 5;
          (p->Ghost).pFanin0 = pIVar5;
          (p->Ghost).pFanin1 = Entry;
          if (Entry != (Ivy_Obj_t *)0x0) {
            if (pIVar5 == (Ivy_Obj_t *)0x0) {
              iVar8 = 0;
            }
            else {
              iVar8 = pIVar14->Id;
            }
            if (pIVar7->Id < iVar8) {
              (p->Ghost).pFanin0 = Entry;
              (p->Ghost).pFanin1 = pIVar5;
            }
          }
          pIVar7 = Ivy_TableLookup(p,&p->Ghost);
          if (pIVar7 != (Ivy_Obj_t *)0x0) {
            if (Entry != pIVar6) goto LAB_00737c0f;
            break;
          }
        }
      }
    }
    pIVar5 = (Ivy_Obj_t *)Vec_PtrPop(vSuper);
    pIVar6 = (Ivy_Obj_t *)Vec_PtrPop(vSuper);
    pIVar5 = Ivy_Oper(p,pIVar5,pIVar6,Type);
    uVar1 = vSuper->nSize;
    uVar13 = (ulong)uVar1;
    uVar9 = 0;
    if (0 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    uVar10 = 0;
    do {
      if (uVar9 == uVar10) {
        Vec_PtrPush(vSuper,pIVar5);
        uVar13 = (ulong)(uint)vSuper->nSize;
        uVar9 = uVar13;
        goto LAB_00737c90;
      }
      ppvVar2 = vSuper->pArray + uVar10;
      uVar10 = uVar10 + 1;
    } while ((Ivy_Obj_t *)*ppvVar2 != pIVar5);
  } while( true );
LAB_00737c90:
  if ((int)uVar9 < 2) goto LAB_00737a68;
  ppvVar2 = vSuper->pArray;
  pvVar3 = ppvVar2[uVar9 - 1];
  if (*(uint *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8) >> 0xb <=
      *(uint *)(((ulong)ppvVar2[uVar9 - 2] & 0xfffffffffffffffe) + 8) >> 0xb) goto LAB_00737a68;
  ppvVar2[uVar9 - 1] = ppvVar2[uVar9 - 2];
  vSuper->pArray[uVar9 - 2] = pvVar3;
  uVar9 = uVar9 - 1;
  goto LAB_00737c90;
}

Assistant:

Ivy_Obj_t * Ivy_NodeBalanceBuildSuper( Ivy_Man_t * p, Vec_Ptr_t * vSuper, Ivy_Type_t Type, int fUpdateLevel )
{
    Ivy_Obj_t * pObj1, * pObj2;
    int LeftBound;
    assert( vSuper->nSize > 1 );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Ivy_NodeCompareLevelsDecrease );
    // balance the nodes
    while ( vSuper->nSize > 1 )
    {
        // find the left bound on the node to be paired
        LeftBound = (!fUpdateLevel)? 0 : Ivy_NodeBalanceFindLeft( vSuper );
        // find the node that can be shared (if no such node, randomize choice)
        Ivy_NodeBalancePermute( p, vSuper, LeftBound, Type == IVY_EXOR );
        // pull out the last two nodes
        pObj1 = (Ivy_Obj_t *)Vec_PtrPop(vSuper);
        pObj2 = (Ivy_Obj_t *)Vec_PtrPop(vSuper);
        Ivy_NodeBalancePushUniqueOrderByLevel( vSuper, Ivy_Oper(p, pObj1, pObj2, Type) );
    }
    return (Ivy_Obj_t *)Vec_PtrEntry(vSuper, 0);
}